

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O0

void pybind11::detail::traverse_offset_bases
               (void *valueptr,type_info *tinfo,instance *self,_func_bool_void_ptr_instance_ptr *f)

{
  bool bVar1;
  PyObject **ppPVar2;
  type_info *tinfo_00;
  reference ppVar3;
  type_info *valueptr_00;
  void *parentptr;
  pair<const_std::type_info_*,_void_*(*)(void_*)> *c;
  iterator __end4;
  iterator __begin4;
  vector<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
  *__range4;
  type_info *parent_tinfo;
  handle h;
  tuple_iterator __end2;
  sequence_fast_readonly local_48;
  tuple_iterator __begin2;
  tuple local_38;
  pybind11 *local_30;
  tuple *__range2;
  _func_bool_void_ptr_instance_ptr *f_local;
  instance *self_local;
  type_info *tinfo_local;
  void *valueptr_local;
  
  __range2 = (tuple *)f;
  f_local = (_func_bool_void_ptr_instance_ptr *)self;
  self_local = (instance *)tinfo;
  tinfo_local = (type_info *)valueptr;
  handle::handle((handle *)&__begin2,tinfo->type->tp_bases);
  reinterpret_borrow<pybind11::tuple>
            ((pybind11 *)&local_38,(handle)__begin2.super_sequence_fast_readonly.ptr);
  local_30 = (pybind11 *)&local_38;
  local_48.ptr = (PyObject **)pybind11::tuple::begin(&local_38);
  h.m_ptr = (PyObject *)pybind11::tuple::end((tuple *)local_30);
  do {
    bVar1 = operator!=((It *)&local_48,(It *)&h);
    if (!bVar1) {
      pybind11::tuple::~tuple(&local_38);
      return;
    }
    parent_tinfo = (type_info *)
                   generic_iterator<pybind11::detail::iterator_policies::sequence_fast_readonly>::
                   operator*((generic_iterator<pybind11::detail::iterator_policies::sequence_fast_readonly>
                              *)&local_48);
    ppPVar2 = handle::ptr((handle *)&parent_tinfo);
    tinfo_00 = get_type_info((PyTypeObject *)*ppPVar2);
    if (tinfo_00 != (type_info *)0x0) {
      __end4 = std::
               vector<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
               ::begin(&tinfo_00->implicit_casts);
      c = (pair<const_std::type_info_*,_void_*(*)(void_*)> *)
          std::
          vector<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
          ::end(&tinfo_00->implicit_casts);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_*,_std::vector<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>_>
                                         *)&c), bVar1) {
        ppVar3 = __gnu_cxx::
                 __normal_iterator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_*,_std::vector<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>_>
                 ::operator*(&__end4);
        if ((PyTypeObject *)ppVar3->first == (self_local->ob_base).ob_type) {
          valueptr_00 = (type_info *)(*ppVar3->second)(tinfo_local);
          if (valueptr_00 != tinfo_local) {
            (*(code *)__range2)(valueptr_00,f_local);
          }
          traverse_offset_bases
                    (valueptr_00,tinfo_00,(instance *)f_local,
                     (_func_bool_void_ptr_instance_ptr *)__range2);
          break;
        }
        __gnu_cxx::
        __normal_iterator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_*,_std::vector<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>_>
        ::operator++(&__end4);
      }
    }
    generic_iterator<pybind11::detail::iterator_policies::sequence_fast_readonly>::operator++
              ((generic_iterator<pybind11::detail::iterator_policies::sequence_fast_readonly> *)
               &local_48);
  } while( true );
}

Assistant:

inline void traverse_offset_bases(void *valueptr, const detail::type_info *tinfo, instance *self,
        bool (*f)(void * /*parentptr*/, instance * /*self*/)) {
    for (handle h : reinterpret_borrow<tuple>(tinfo->type->tp_bases)) {
        if (auto parent_tinfo = get_type_info((PyTypeObject *) h.ptr())) {
            for (auto &c : parent_tinfo->implicit_casts) {
                if (c.first == tinfo->cpptype) {
                    auto *parentptr = c.second(valueptr);
                    if (parentptr != valueptr)
                        f(parentptr, self);
                    traverse_offset_bases(parentptr, parent_tinfo, self, f);
                    break;
                }
            }
        }
    }
}